

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_slot.h
# Opt level: O0

void __thiscall
cppnet::ListSlot<cppnet::BufferBlock>::~ListSlot(ListSlot<cppnet::BufferBlock> *this)

{
  ListSlot<cppnet::BufferBlock> *this_local;
  
  this->_vptr_ListSlot = (_func_int **)&PTR__ListSlot_00167cb0;
  std::shared_ptr<cppnet::BufferBlock>::~shared_ptr(&this->_next);
  std::weak_ptr<cppnet::BufferBlock>::~weak_ptr(&this->_prev);
  return;
}

Assistant:

virtual ~ListSlot() {}